

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mailbox_safe.cpp
# Opt level: O0

void __thiscall zmq::mailbox_safe_t::~mailbox_safe_t(mailbox_safe_t *this)

{
  ypipe_t<zmq::command_t,_16> *in_RDI;
  vector<zmq::signaler_t_*,_std::allocator<zmq::signaler_t_*>_> *unaff_retaddr;
  
  mutex_t::lock((mutex_t *)in_RDI);
  mutex_t::unlock((mutex_t *)in_RDI);
  std::vector<zmq::signaler_t_*,_std::allocator<zmq::signaler_t_*>_>::~vector(unaff_retaddr);
  condition_variable_t::~condition_variable_t((condition_variable_t *)0x22a2e3);
  ypipe_t<zmq::command_t,_16>::~ypipe_t(in_RDI);
  i_mailbox::~i_mailbox((i_mailbox *)in_RDI);
  return;
}

Assistant:

zmq::mailbox_safe_t::~mailbox_safe_t ()
{
    //  TODO: Retrieve and deallocate commands inside the cpipe.

    // Work around problem that other threads might still be in our
    // send() method, by waiting on the mutex before disappearing.
    _sync->lock ();
    _sync->unlock ();
}